

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O1

bool __thiscall PSEngine::advanced_movement_resolution(PSEngine *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer psVar1;
  _Rb_tree_node_base *p_Var2;
  pointer psVar3;
  pointer p_containing_cell;
  vector<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>
  objects_to_move;
  RuleDelta movement_deltas;
  shared_ptr<CompiledGame::PrimaryObject> local_108;
  vector<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>
  local_f8;
  pointer local_e0;
  RuleDelta local_d8;
  
  local_d8.movement_deltas.
  super__Vector_base<PSEngine::MovementDelta,_std::allocator<PSEngine::MovementDelta>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.movement_deltas.
  super__Vector_base<PSEngine::MovementDelta,_std::allocator<PSEngine::MovementDelta>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.movement_deltas.
  super__Vector_base<PSEngine::MovementDelta,_std::allocator<PSEngine::MovementDelta>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.rule_applied.rule_line = -1;
  local_d8.rule_applied.is_late_rule = false;
  local_d8.rule_applied.direction = None;
  local_d8.rule_applied.match_patterns.
  super__Vector_base<CompiledGame::Pattern,_std::allocator<CompiledGame::Pattern>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.rule_applied.match_patterns.
  super__Vector_base<CompiledGame::Pattern,_std::allocator<CompiledGame::Pattern>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.rule_applied.match_patterns.
  super__Vector_base<CompiledGame::Pattern,_std::allocator<CompiledGame::Pattern>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.rule_applied.result_patterns.
  super__Vector_base<CompiledGame::Pattern,_std::allocator<CompiledGame::Pattern>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.rule_applied.result_patterns.
  super__Vector_base<CompiledGame::Pattern,_std::allocator<CompiledGame::Pattern>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.rule_applied.result_patterns.
  super__Vector_base<CompiledGame::Pattern,_std::allocator<CompiledGame::Pattern>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.rule_applied.commands.
  super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.rule_applied.commands.
  super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.rule_applied.commands.
  super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.rule_applied.deltas.
  super__Vector_base<CompiledGame::Delta,_std::allocator<CompiledGame::Delta>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.rule_applied.deltas.
  super__Vector_base<CompiledGame::Delta,_std::allocator<CompiledGame::Delta>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.rule_applied.deltas.
  super__Vector_base<CompiledGame::Delta,_std::allocator<CompiledGame::Delta>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.rule_application_deltas.
  super__Vector_base<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.rule_application_deltas.
  super__Vector_base<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.rule_application_deltas.
  super__Vector_base<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.is_movement_resolution = true;
  p_containing_cell =
       (this->m_current_level).cells.
       super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_e0 = (this->m_current_level).cells.
             super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (p_containing_cell != local_e0) {
    do {
      local_f8.
      super__Vector_base<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_f8.
      super__Vector_base<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f8.
      super__Vector_base<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      p_Var2 = (p_containing_cell->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      psVar3 = local_f8.
               super__Vector_base<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar1 = local_f8.
               super__Vector_base<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      while (local_f8.
             super__Vector_base<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>
             ._M_impl.super__Vector_impl_data._M_start = psVar3,
            local_f8.
            super__Vector_base<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = psVar1,
            (_Rb_tree_header *)p_Var2 !=
            &(p_containing_cell->objects)._M_t._M_impl.super__Rb_tree_header) {
        if (*(int *)&p_Var2[1]._M_left != 6) {
          if (*(int *)&p_Var2[1]._M_left == 5) {
            *(undefined4 *)&p_Var2[1]._M_left = 6;
          }
          else {
            std::
            vector<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>
            ::push_back(&local_f8,(value_type *)(p_Var2 + 1));
          }
        }
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
        psVar3 = local_f8.
                 super__Vector_base<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar1 = local_f8.
                 super__Vector_base<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      for (; psVar3 != psVar1; psVar3 = psVar3 + 1) {
        local_108.super___shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (psVar3->super___shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr;
        this_00 = (psVar3->
                  super___shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
        }
        local_108.super___shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = this_00;
        try_to_move_object(this,p_containing_cell,&local_108,&local_d8);
        if (local_108.super___shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_108.
                     super___shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
      }
      std::
      vector<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>
      ::~vector(&local_f8);
      p_containing_cell = p_containing_cell + 1;
    } while (p_containing_cell != local_e0);
  }
  std::vector<PSEngine::RuleDelta,_std::allocator<PSEngine::RuleDelta>_>::push_back
            (&(this->m_turn_history).subturns.
              super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].steps,&local_d8);
  std::vector<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>::
  ~vector(&local_d8.rule_application_deltas);
  std::vector<CompiledGame::Delta,_std::allocator<CompiledGame::Delta>_>::~vector
            (&local_d8.rule_applied.deltas);
  std::vector<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>::~vector
            (&local_d8.rule_applied.commands);
  std::vector<CompiledGame::Pattern,_std::allocator<CompiledGame::Pattern>_>::~vector
            (&local_d8.rule_applied.result_patterns);
  std::vector<CompiledGame::Pattern,_std::allocator<CompiledGame::Pattern>_>::~vector
            (&local_d8.rule_applied.match_patterns);
  std::vector<PSEngine::MovementDelta,_std::allocator<PSEngine::MovementDelta>_>::~vector
            (&local_d8.movement_deltas);
  return true;
}

Assistant:

bool PSEngine::advanced_movement_resolution()
{
    RuleDelta movement_deltas;
    movement_deltas.is_movement_resolution = true;


    for(Cell& cell : m_current_level.cells)
    {
        vector<shared_ptr<CompiledGame::PrimaryObject>> objects_to_move;

        for(auto& pair : cell.objects )
        {
            if(pair.second == ObjectMoveType::Action)
            {
                //todo do we consider Action as a movement in the turn history ?
                pair.second = ObjectMoveType::Stationary;
            }
            else if(pair.second != ObjectMoveType::Stationary)
            {
                objects_to_move.push_back(pair.first);
            }
        }

        for(auto obj : objects_to_move)
        {
            if( !try_to_move_object(cell, obj, movement_deltas) )
            {
                //should return false only if the player can't move ?
            }
        }
    }

    m_turn_history.subturns.back().steps.push_back(movement_deltas);

    return true;
}